

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jas_stream.c
# Opt level: O1

char * jas_stream_gets(jas_stream_t *stream,char *buf,int bufsize)

{
  byte *pbVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  
  if (bufsize < 1) {
    __assert_fail("bufsize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jasper-maint[P]jasper/src/libjasper/base/jas_stream.c"
                  ,0x2e4,"char *jas_stream_gets(jas_stream_t *, char *, int)");
  }
  iVar3 = jas_getdbglevel();
  if (99 < iVar3) {
    jas_eprintf("jas_stream_gets(%p, %p, %d)\n",stream,buf,(ulong)(uint)bufsize);
  }
  pcVar5 = buf;
  if (bufsize != 1) {
    while( true ) {
      uVar4 = 0xffffffff;
      if ((stream->flags_ & 7U) == 0) {
        if ((stream->rwlimit_ < 0) || (stream->rwcnt_ < stream->rwlimit_)) {
          iVar3 = stream->cnt_;
          stream->cnt_ = iVar3 + -1;
          if (iVar3 < 1) {
            uVar4 = jas_stream_fillbuf(stream,1);
          }
          else {
            stream->rwcnt_ = stream->rwcnt_ + 1;
            pbVar1 = stream->ptr_;
            stream->ptr_ = pbVar1 + 1;
            uVar4 = (uint)*pbVar1;
          }
        }
        else {
          stream->flags_ = stream->flags_ | 4;
        }
      }
      if (uVar4 == 0xffffffff) break;
      *pcVar5 = (char)uVar4;
      pcVar5 = pcVar5 + 1;
      if ((uVar4 == 10) || (bVar2 = bufsize < 3, bufsize = bufsize + -1, bVar2)) break;
    }
  }
  *pcVar5 = '\0';
  return buf;
}

Assistant:

char *jas_stream_gets(jas_stream_t *stream, char *buf, int bufsize)
{
	int c;
	char *bufptr;
	assert(bufsize > 0);

	JAS_DBGLOG(100, ("jas_stream_gets(%p, %p, %d)\n", stream, buf, bufsize));

	bufptr = buf;
	while (bufsize > 1) {
		if ((c = jas_stream_getc(stream)) == EOF) {
			break;
		}
		*bufptr++ = c;
		--bufsize;
		if (c == '\n') {
			break;
		}
	}
	*bufptr = '\0';
	return buf;
}